

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::AppendBuildInterfaceIncludes(cmTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char *local_1c8;
  char *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string dirs;
  char *srcDir;
  char *binDir;
  allocator local_31;
  string local_30;
  cmTarget *local_10;
  cmTarget *this_local;
  
  local_10 = this;
  TVar2 = GetType(this);
  if (((((TVar2 == SHARED_LIBRARY) || (TVar2 = GetType(this), TVar2 == STATIC_LIBRARY)) ||
       (TVar2 = GetType(this), TVar2 == MODULE_LIBRARY)) ||
      ((TVar2 = GetType(this), TVar2 == INTERFACE_LIBRARY ||
       (bVar1 = IsExecutableWithExports(this), bVar1)))) &&
     ((this->BuildInterfaceIncludesAppended & 1U) == 0)) {
    this->BuildInterfaceIncludesAppended = true;
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_30,"CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE",&local_31);
    bVar1 = cmMakefile::IsOn(this_00,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    if (bVar1) {
      pcVar3 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      dirs.field_2._8_8_ = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
      local_1a0 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        local_1a0 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,local_1a0,&local_b9);
      pcVar4 = "";
      if (pcVar3 != (char *)0x0) {
        pcVar4 = ";";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,pcVar4,&local_e1);
      std::operator+(&local_98,&local_b8,&local_e0);
      if (dirs.field_2._8_8_ == 0) {
        local_1c8 = "";
      }
      else {
        local_1c8 = (char *)dirs.field_2._8_8_;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,local_1c8,&local_109);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &local_98,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_130,"INTERFACE_INCLUDE_DIRECTORIES",&local_131);
        std::operator+(&local_178,"$<BUILD_INTERFACE:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        std::operator+(&local_158,&local_178,">");
        pcVar3 = (char *)std::__cxx11::string::c_str();
        AppendProperty(this,&local_130,pcVar3,false);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
      }
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  return;
}

Assistant:

void cmTarget::AppendBuildInterfaceIncludes()
{
  if(this->GetType() != cmState::SHARED_LIBRARY &&
     this->GetType() != cmState::STATIC_LIBRARY &&
     this->GetType() != cmState::MODULE_LIBRARY &&
     this->GetType() != cmState::INTERFACE_LIBRARY &&
     !this->IsExecutableWithExports())
    {
    return;
    }
  if (this->BuildInterfaceIncludesAppended)
    {
    return;
    }
  this->BuildInterfaceIncludesAppended = true;

  if (this->Makefile->IsOn("CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE"))
    {
    const char *binDir = this->Makefile->GetCurrentBinaryDirectory();
    const char *srcDir = this->Makefile->GetCurrentSourceDirectory();
    const std::string dirs = std::string(binDir ? binDir : "")
                            + std::string(binDir ? ";" : "")
                            + std::string(srcDir ? srcDir : "");
    if (!dirs.empty())
      {
      this->AppendProperty("INTERFACE_INCLUDE_DIRECTORIES",
                            ("$<BUILD_INTERFACE:" + dirs + ">").c_str());
      }
    }
}